

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O0

void __thiscall duckdb::LogManager::Initialize(LogManager *this)

{
  LogManager *in_RDI;
  LoggingContext in_stack_00000010;
  LoggingContext context;
  undefined8 in_stack_ffffffffffffff68;
  LoggingContext *in_stack_ffffffffffffff70;
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *local_60;
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *puStack_58;
  undefined1 local_30 [38];
  undefined1 in_stack_fffffffffffffff6;
  undefined1 in_stack_fffffffffffffff7;
  
  LoggingContext::LoggingContext
            (in_stack_ffffffffffffff70,(LogContextScope)((ulong)in_stack_ffffffffffffff68 >> 0x38));
  memcpy(&local_60,local_30,0x28);
  CreateLogger(in_RDI,in_stack_00000010,(bool)in_stack_fffffffffffffff7,
               (bool)in_stack_fffffffffffffff6);
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::operator=
            (puStack_58,local_60);
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *)0x61eee2);
  return;
}

Assistant:

void LogManager::Initialize() {
	LoggingContext context(LogContextScope::DATABASE);
	global_logger = CreateLogger(context, true, true);
}